

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

void xLearn::AccMetric::acc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pred,size_t start_idx,size_t end_idx)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined8 uVar3;
  bool bVar4;
  ostream *poVar5;
  size_t i;
  float fVar6;
  float fVar7;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (start_idx <= end_idx) {
    *true_pred = 0;
    if (start_idx < end_idx) {
      pfVar1 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)pfVar1[start_idx]),1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar6 = (float)((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * -0x40800000);
        uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)pfVar2[start_idx]),1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar7 = (float)((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * -0x40800000);
        if ((fVar6 == fVar7) && (!NAN(fVar6) && !NAN(fVar7))) {
          *true_pred = *true_pred + 1;
        }
        start_idx = start_idx + 1;
      } while (end_idx != start_idx);
    }
    return;
  }
  local_6c.severity_ = ERR;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             "");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"acc_accum_thread","");
  poVar5 = Logger::Start(ERR,&local_48,0x76,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_GE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x76);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"end_idx",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"start_idx",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

static void acc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               index_t* true_pred,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pred = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label == r_label) {
        (*true_pred)++;
      }
    }
  }